

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapCool(Layer *l,int *out,int x,int z,int w,int h)

{
  int b;
  int c;
  int d;
  int iVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v12;
  int v01;
  int v21;
  int v10;
  int v11;
  int err;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_4;
  
  lVar3 = (long)(in_R8D + 2);
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar3,
                       (long)(in_R9D + 2));
  if (local_4 == 0) {
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        local_58 = *(int *)(in_RSI + (local_48 + 1 + (local_50 + 1) * lVar3) * 4);
        if (local_58 == 1) {
          iVar2 = *(int *)(in_RSI + (local_48 + 1 + local_50 * lVar3) * 4);
          b = *(int *)(in_RSI + (local_48 + 2 + (local_50 + 1) * lVar3) * 4);
          c = *(int *)(in_RSI + (local_48 + (local_50 + 1) * lVar3) * 4);
          d = *(int *)(in_RSI + (local_48 + 1 + (local_50 + 2) * lVar3) * 4);
          iVar1 = isAny4(3,iVar2,b,c,d);
          if ((iVar1 != 0) || (iVar2 = isAny4(4,iVar2,b,c,d), iVar2 != 0)) {
            local_58 = 2;
          }
        }
        *(int *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = local_58;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapCool(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];

            if (v11 == Warm)
            {
                int v10 = out[i+1 + (j+0)*pW];
                int v21 = out[i+2 + (j+1)*pW];
                int v01 = out[i+0 + (j+1)*pW];
                int v12 = out[i+1 + (j+2)*pW];

                if (isAny4(Cold, v10, v21, v01, v12) || isAny4(Freezing, v10, v21, v01, v12))
                {
                    v11 = Lush;
                }
            }

            out[i + j*w] = v11;
        }
    }

    return 0;
}